

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_formparse.c
# Opt level: O3

void tool_mime_free(tool_mime *mime)

{
  if (mime != (tool_mime *)0x0) {
    if (mime->subparts != (tool_mime *)0x0) {
      tool_mime_free(mime->subparts);
    }
    if (mime->prev != (tool_mime *)0x0) {
      tool_mime_free(mime->prev);
    }
    free(mime->name);
    mime->name = (char *)0x0;
    free(mime->filename);
    mime->filename = (char *)0x0;
    free(mime->type);
    mime->type = (char *)0x0;
    free(mime->encoder);
    mime->encoder = (char *)0x0;
    free(mime->data);
    mime->data = (char *)0x0;
    curl_slist_free_all(mime->headers);
    free(mime);
    return;
  }
  return;
}

Assistant:

void tool_mime_free(struct tool_mime *mime)
{
  if(mime) {
    if(mime->subparts)
      tool_mime_free(mime->subparts);
    if(mime->prev)
      tool_mime_free(mime->prev);
    CONST_SAFEFREE(mime->name);
    CONST_SAFEFREE(mime->filename);
    CONST_SAFEFREE(mime->type);
    CONST_SAFEFREE(mime->encoder);
    CONST_SAFEFREE(mime->data);
    curl_slist_free_all(mime->headers);
    free(mime);
  }
}